

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O2

bool TtfUtil::GlyfPoints(gid16 nGlyphId,void *pGlyf,void *pLoca,size_t lLocaSize,void *pHead,
                        int *prgnContourEndPoint,size_t cnEndPoints,int *prgnX,int *prgnY,
                        bool *prgfOnCurve,size_t *cnPoints)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  void *pvVar5;
  bool *pbVar6;
  ulong uVar7;
  uint uVar8;
  gid16 nGlyphId_00;
  size_t sVar9;
  ulong uVar10;
  bool fTransOff;
  void *local_d8;
  size_t local_d0;
  ulong local_c8;
  void *local_c0;
  void *local_b8;
  size_t cActualPts;
  float flt22;
  float flt21;
  float flt12;
  float flt11;
  int b;
  int a;
  ulong local_90;
  ushort *local_88;
  bool *local_80;
  size_t local_78;
  size_t cNestedPts;
  int *local_68;
  size_t cCompId;
  int rgnCompId [8];
  
  rgnCompId[0] = 0x7fffffff;
  local_d8 = pHead;
  local_d0 = lLocaSize;
  local_b8 = pGlyf;
  local_68 = prgnContourEndPoint;
  std::__fill_n_a<int*,unsigned_long,int>(prgnX,*cnPoints,rgnCompId);
  sVar9 = local_d0;
  pvVar5 = local_d8;
  rgnCompId[0] = 0x7fffffff;
  std::__fill_n_a<int*,unsigned_long,int>(prgnY,*cnPoints,rgnCompId);
  bVar4 = IsSpace(nGlyphId,pLoca,sVar9,pvVar5);
  if ((!bVar4) &&
     (local_88 = (ushort *)GlyfLookup(nGlyphId,local_b8,pLoca,sVar9,pvVar5),
     local_88 != (ushort *)0x0)) {
    if ((short)(*local_88 << 8 | *local_88 >> 8) < 1) {
      cCompId = 0;
      local_c0 = pLoca;
      bVar4 = GetComponentGlyphIds(local_88,rgnCompId,8,&cCompId);
      if (bVar4) {
        sVar9 = *cnPoints;
        fTransOff = true;
        local_c8 = cCompId;
        uVar10 = 0;
        pbVar6 = prgfOnCurve;
        while( true ) {
          if (uVar10 == local_c8) {
            SimplifyFlags(prgfOnCurve,*cnPoints);
            *cnPoints = sVar9;
            return true;
          }
          iVar1 = rgnCompId[uVar10];
          nGlyphId_00 = (gid16)iVar1;
          local_80 = pbVar6;
          local_78 = sVar9;
          bVar4 = IsSpace(nGlyphId_00,local_c0,local_d0,local_d8);
          if ((bVar4) ||
             (pvVar5 = GlyfLookup(nGlyphId_00,local_b8,local_c0,local_d0,local_d8), sVar3 = local_78
             , pbVar6 = local_80, pvVar5 == (void *)0x0)) break;
          local_90 = uVar10;
          bVar4 = GlyfPoints(pvVar5,prgnX,prgnY,local_80,local_78,&cActualPts);
          sVar9 = cActualPts;
          if (bVar4) {
            CalcAbsolutePoints(prgnX,prgnY,cActualPts);
          }
          else {
            cNestedPts = sVar3;
            bVar4 = GlyfPoints(nGlyphId_00,local_b8,local_c0,local_d0,local_d8,local_68,cnEndPoints,
                               prgnX,prgnY,pbVar6,&cNestedPts);
            if (!bVar4) {
              bVar4 = local_90 < local_c8;
              goto LAB_001acedc;
            }
            sVar9 = sVar3 - cNestedPts;
            cActualPts = sVar9;
          }
          bVar4 = GetComponentPlacement(local_88,iVar1,false,&a,&b);
          uVar10 = local_90;
          if ((!bVar4) ||
             (bVar4 = GetComponentTransform(local_88,iVar1,&flt11,&flt12,&flt21,&flt22,&fTransOff),
             !bVar4)) break;
          if (((((flt11 != 1.0) || (NAN(flt11))) || (flt12 != 0.0)) ||
              ((NAN(flt12) || (flt21 != 0.0)))) ||
             ((NAN(flt21) || ((flt22 != 1.0 || (NAN(flt22))))))) {
            for (uVar8 = 0; uVar7 = (ulong)uVar8, uVar7 < sVar9; uVar8 = uVar8 + 1) {
              iVar1 = prgnX[uVar7];
              iVar2 = prgnY[uVar7];
              prgnX[uVar7] = (int)((float)iVar1 * flt11 + flt12 * (float)iVar2);
              prgnY[uVar7] = (int)((float)iVar1 * flt21 + (float)iVar2 * flt22);
            }
          }
          for (uVar8 = 0; uVar7 = (ulong)uVar8, uVar7 < sVar9; uVar8 = uVar8 + 1) {
            prgnX[uVar7] = prgnX[uVar7] + a;
            prgnY[uVar7] = prgnY[uVar7] + b;
          }
          prgnX = prgnX + sVar9;
          prgnY = prgnY + sVar9;
          pbVar6 = local_80 + sVar9;
          sVar9 = local_78 - sVar9;
          uVar10 = uVar10 + 1;
        }
        bVar4 = uVar10 < local_c8;
LAB_001acedc:
        return !bVar4;
      }
    }
    else {
      bVar4 = GlyfPoints(local_88,prgnX,prgnY,prgfOnCurve,*cnPoints,&cActualPts);
      if (bVar4) {
        CalcAbsolutePoints(prgnX,prgnY,*cnPoints);
        SimplifyFlags(prgfOnCurve,*cnPoints);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GlyfPoints(gr::gid16 nGlyphId, const void * pGlyf,
		const void * pLoca, size_t lLocaSize, const void * pHead,
		const int * prgnContourEndPoint, size_t cnEndPoints,
		int * prgnX, int * prgnY, bool * prgfOnCurve, size_t & cnPoints)
{
	std::fill_n(prgnX, cnPoints, INT_MAX);
	std::fill_n(prgnY, cnPoints, INT_MAX);

	if (IsSpace(nGlyphId, pLoca, lLocaSize, pHead)) 
		return false;

	void * pSimpleGlyf = GlyfLookup(nGlyphId, pGlyf, pLoca, lLocaSize, pHead);
	if (pSimpleGlyf == NULL)
		return false;

	int cContours = GlyfContourCount(pSimpleGlyf);
	size_t cActualPts;
	if (cContours > 0)
	{
		if (!GlyfPoints(pSimpleGlyf, prgnX, prgnY, (char *)prgfOnCurve, cnPoints, cActualPts))
			return false;
		CalcAbsolutePoints(prgnX, prgnY, cnPoints);
		SimplifyFlags((char *)prgfOnCurve, cnPoints);
		return true;
	}

	// handle composite glyphs	
	int rgnCompId[kMaxGlyphComponents]; // assumes no glyph will be made of more than 8 components
	size_t cCompIdTotal = kMaxGlyphComponents;
	size_t cCompId = 0;

	// this will fail if there are more components than there is room for
	if (!GetComponentGlyphIds(pSimpleGlyf, rgnCompId, cCompIdTotal, cCompId))
		return false;

	int * prgnCurrentX = prgnX;
	int * prgnCurrentY = prgnY;
	char * prgbCurrentFlag = (char *)prgfOnCurve; // converting bool to char should be safe
	auto cCurrentPoints = cnPoints;
	bool fOffset = true, fTransOff = true;
	int a, b;
	float flt11, flt12, flt21, flt22;
	// int * prgnPrevX = prgnX; // in case first att pt number relative to preceding glyph
	// int * prgnPrevY = prgnY;
	for (size_t i = 0; i < cCompId; i++)
	{
		if (IsSpace(static_cast<gr::gid16>(rgnCompId[i]), pLoca, lLocaSize, pHead)) {return false;}
		void * pCompGlyf = GlyfLookup(static_cast<gr::gid16>(rgnCompId[i]), pGlyf, 
										pLoca, lLocaSize, pHead);
		if (pCompGlyf == NULL) {return false;}
		if (!GlyfPoints(pCompGlyf, prgnCurrentX, prgnCurrentY, prgbCurrentFlag, 
						cCurrentPoints, cActualPts))
		{
			auto cNestedPts = cCurrentPoints;
			if (!GlyfPoints(static_cast<gr::gid16>(rgnCompId[i]), pGlyf, pLoca, lLocaSize, pHead, 
				prgnContourEndPoint, cnEndPoints, prgnCurrentX, prgnCurrentY, (bool *)prgbCurrentFlag, 
				cNestedPts))
				return false;
			cActualPts = cCurrentPoints - cNestedPts;
		} 
		else
		{
			// convert points to absolute coordinates
			// do before transform and attachment point placement are applied
			CalcAbsolutePoints(prgnCurrentX, prgnCurrentY, cActualPts);
		}

		if (!GetComponentPlacement(pSimpleGlyf, rgnCompId[i], fOffset, a, b))
			return false;
		if (!GetComponentTransform(pSimpleGlyf, rgnCompId[i], 
			flt11, flt12, flt21, flt22, fTransOff))
			return false;
		bool fIdTrans = flt11 == 1.0 && flt12 == 0.0 && flt21 == 0.0 && flt22 == 1.0;

		// apply transform - see main method note above
		// do before attachment point calcs
		if (!fIdTrans)
			for (auto j = 0U; j < cActualPts; j++)
			{
				int x = prgnCurrentX[j]; // store before transform applied
				int y = prgnCurrentY[j];
				prgnCurrentX[j] = (int)(x * flt11 + y * flt12);
				prgnCurrentY[j] = (int)(x * flt21 + y * flt22);
			}
			
		// apply placement - see main method note above
		int nXOff, nYOff;
		if (fOffset) // explicit x & y offsets
		{ 
			/* ignore fTransOff for now
			if (fTransOff && !fIdTrans) 
			{ 	// transform x & y offsets
				nXOff = (int)(a * flt11 + b * flt12);
				nYOff = (int)(a * flt21 + b * flt22);
			}
			else */ 
			{ // don't transform offset
				nXOff = a;
				nYOff = b;
			}
		}
		else  // attachment points
		{	// in case first point is relative to preceding glyph and second relative to current
			// nXOff = prgnPrevX[a] - prgnCurrentX[b];
			// nYOff = prgnPrevY[a] - prgnCurrentY[b];
			// first point number relative to whole composite, second relative to current glyph
			nXOff = prgnX[a] - prgnCurrentX[b];
			nYOff = prgnY[a] - prgnCurrentY[b];
		}
		for (auto j = 0U; j < cActualPts; j++)
		{
			prgnCurrentX[j] += nXOff;
			prgnCurrentY[j] += nYOff;
		}

		// prgnPrevX = prgnCurrentX;
		// prgnPrevY = prgnCurrentY;
		prgnCurrentX += cActualPts;
		prgnCurrentY += cActualPts;
		prgbCurrentFlag += cActualPts;
		cCurrentPoints -= cActualPts;
	}

	SimplifyFlags((char *)prgfOnCurve, cnPoints);
	cnPoints = cCurrentPoints;

	return true;
}